

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImpl.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImpl::processSensorEvents(WindowImpl *this)

{
  bool bVar1;
  SensorManager *pSVar2;
  Vector3f *pVVar3;
  WindowImpl *in_RDI;
  Vector3f VVar4;
  Event event;
  Vector3f previousValue;
  Type sensor;
  uint i;
  Event *in_stack_ffffffffffffff98;
  SensorManager *in_stack_ffffffffffffffc0;
  float local_38;
  Vector3<float> local_20;
  Type local_10;
  Type local_c;
  
  SensorManager::getInstance();
  SensorManager::update(in_stack_ffffffffffffffc0);
  for (local_c = Accelerometer; local_c < Count; local_c = local_c + Gyroscope) {
    local_10 = local_c;
    pSVar2 = SensorManager::getInstance();
    bVar1 = SensorManager::isEnabled(pSVar2,local_10);
    if (bVar1) {
      local_20.z = in_RDI->m_sensorValue[local_c].z;
      local_20.x = in_RDI->m_sensorValue[local_c].x;
      local_20.y = in_RDI->m_sensorValue[local_c].y;
      pSVar2 = SensorManager::getInstance();
      VVar4 = SensorManager::getValue(pSVar2,local_10);
      local_38 = VVar4.z;
      pVVar3 = in_RDI->m_sensorValue + local_c;
      pVVar3->x = (float)(int)VVar4._0_8_;
      pVVar3->y = (float)(int)((ulong)VVar4._0_8_ >> 0x20);
      pVVar3->z = local_38;
      bVar1 = sf::operator!=(in_RDI->m_sensorValue + local_c,&local_20);
      if (bVar1) {
        pushEvent(in_RDI,in_stack_ffffffffffffff98);
      }
    }
  }
  return;
}

Assistant:

void WindowImpl::processSensorEvents()
{
    // First update the sensor states
    SensorManager::getInstance().update();

    for (unsigned int i = 0; i < Sensor::Count; ++i)
    {
        Sensor::Type sensor = static_cast<Sensor::Type>(i);

        // Only process enabled sensors
        if (SensorManager::getInstance().isEnabled(sensor))
        {
            // Copy the previous value of the sensor and get the new one
            Vector3f previousValue = m_sensorValue[i];
            m_sensorValue[i] = SensorManager::getInstance().getValue(sensor);

            // If the value has changed, trigger an event
            if (m_sensorValue[i] != previousValue) // @todo use a threshold?
            {
                Event event;
                event.type = Event::SensorChanged;
                event.sensor.type = sensor;
                event.sensor.x = m_sensorValue[i].x;
                event.sensor.y = m_sensorValue[i].y;
                event.sensor.z = m_sensorValue[i].z;
                pushEvent(event);
            }
        }
    }
}